

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O2

GMM_SURFACESTATE_FORMAT __thiscall
GmmLib::GmmClientContext::GetSurfaceStateFormat(GmmClientContext *this,GMM_RESOURCE_FORMAT Format)

{
  if (Format - GMM_FORMAT_A1B5G5R5_UNORM < 0x180) {
    return (this->pGmmLibContext->pPlatformInfo->Data).FormatTable[Format].SurfaceStateFormat;
  }
  return GMM_SURFACESTATE_FORMAT_INVALID;
}

Assistant:

GMM_SURFACESTATE_FORMAT GMM_STDCALL GmmLib::GmmClientContext::GetSurfaceStateFormat(GMM_RESOURCE_FORMAT Format)
{
    // ToDo: Remove the definition of GmmGetSurfaceStateFormat(Format)
    return ((Format > GMM_FORMAT_INVALID) &&
            (Format < GMM_RESOURCE_FORMATS)) ?
           pGmmLibContext->GetPlatformInfo().FormatTable[Format].SurfaceStateFormat :
           GMM_SURFACESTATE_FORMAT_INVALID;
}